

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiPair.h
# Opt level: O2

void __thiscall
MultiMap::
Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Pair(Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->values);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Pair(const Key& key = Key()) : key(key) {}